

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O3

CordRepBtree * __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::
NewLeaf<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
          (CordRepBtree *this,string_view data,size_t extra)

{
  byte bVar1;
  CordRepBtree *pCVar2;
  CordRep *pCVar3;
  sbyte sVar4;
  long lVar5;
  uint8_t *puVar6;
  int iVar7;
  CordRepBtree *__n;
  long lVar8;
  void *__src;
  bool bVar9;
  
  __src = (void *)data._M_len;
  pCVar2 = (CordRepBtree *)operator_new(0x40);
  (pCVar2->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
  (pCVar2->super_CordRep).tag = '\x03';
  (pCVar2->super_CordRep).storage[0] = '\0';
  (pCVar2->super_CordRep).storage[1] = '\0';
  if (this == (CordRepBtree *)0x0) {
    lVar5 = 0;
    puVar6 = (uint8_t *)0x0;
  }
  else {
    puVar6 = (uint8_t *)0x0;
    lVar8 = 0;
    do {
      pCVar3 = &CordRepFlat::NewImpl<4096ul>((size_t)(data._M_str + (long)&this->super_CordRep))->
                super_CordRep;
      bVar1 = pCVar3->tag;
      sVar4 = 0xc;
      if (bVar1 < 0xbb) {
        sVar4 = 6;
      }
      iVar7 = -0xb800d;
      if (bVar1 < 0xbb) {
        iVar7 = -0xe8d;
      }
      if (bVar1 < 0x43) {
        sVar4 = 3;
        iVar7 = -0x1d;
      }
      __n = (CordRepBtree *)(long)(int)(((uint)bVar1 << sVar4) + iVar7);
      if (this < __n) {
        __n = this;
      }
      ((CordRep *)&pCVar3->length)->length = (size_t)__n;
      puVar6 = (__n->super_CordRep).storage + (long)(puVar6 + -0xd);
      lVar5 = lVar8 + 1;
      pCVar2->edges_[lVar8] = pCVar3;
      memcpy(pCVar3->storage,__src,(size_t)__n);
      this = (CordRepBtree *)((long)this - (long)__n);
    } while ((this != (CordRepBtree *)0x0) &&
            (__src = (void *)((long)__src + (long)__n), bVar9 = lVar8 != 5, lVar8 = lVar5, bVar9));
  }
  (pCVar2->super_CordRep).length = (size_t)puVar6;
  (pCVar2->super_CordRep).storage[2] = (uint8_t)lVar5;
  return pCVar2;
}

Assistant:

CordRepBtree* CordRepBtree::NewLeaf<kBack>(absl::string_view data,
                                           size_t extra) {
  CordRepBtree* leaf = CordRepBtree::New(0);
  size_t length = 0;
  size_t end = 0;
  const size_t cap = leaf->capacity();
  while (!data.empty() && end != cap) {
    auto* flat = CordRepFlat::New(data.length() + extra);
    flat->length = (std::min)(data.length(), flat->Capacity());
    length += flat->length;
    leaf->edges_[end++] = flat;
    data = Consume<kBack>(flat->Data(), data, flat->length);
  }
  leaf->length = length;
  leaf->set_end(end);
  return leaf;
}